

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlValidatePushElement(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_80;
  PyObject *local_78;
  PyObject *local_70;
  undefined8 local_68;
  xmlChar *qname;
  PyObject *pyobj_elem;
  xmlNodePtr elem;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  PyObject *pyobj_ctxt;
  xmlValidCtxtPtr ctxt;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlValidatePushElement");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"OOOz:xmlValidatePushElement",&doc,&elem,&qname,&local_68);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (doc == (xmlDocPtr)&_Py_NoneStruct) {
        local_70 = (PyObject *)0x0;
      }
      else {
        local_70 = (PyObject *)doc->name;
      }
      pyobj_ctxt = local_70;
      if (elem == (xmlNodePtr)&_Py_NoneStruct) {
        local_78 = (PyObject *)0x0;
      }
      else {
        local_78 = (PyObject *)elem->name;
      }
      pyobj_doc = local_78;
      if (qname == &_Py_NoneStruct) {
        local_80 = (PyObject *)0x0;
      }
      else {
        local_80 = *(PyObject **)(qname + 0x10);
      }
      pyobj_elem = local_80;
      ctxt._4_4_ = xmlValidatePushElement(local_70,local_78,local_80,local_68);
      self_local = libxml_intWrap(ctxt._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidatePushElement(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr elem;
    PyObject *pyobj_elem;
    xmlChar * qname;

    if (libxml_deprecationWarning("xmlValidatePushElement") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOOz:xmlValidatePushElement", &pyobj_ctxt, &pyobj_doc, &pyobj_elem, &qname))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    elem = (xmlNodePtr) PyxmlNode_Get(pyobj_elem);

    c_retval = xmlValidatePushElement(ctxt, doc, elem, qname);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}